

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitArrayGet(FunctionValidator *this,ArrayGet *curr)

{
  Type left;
  bool bVar1;
  HeapType right;
  Type local_50;
  HeapType local_48;
  int local_40;
  uintptr_t local_38;
  HeapType heapType;
  
  shouldBeTrue<wasm::ArrayGet*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "array.get requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayGet*,wasm::Type>
            (this,(Type)(curr->index->type).id,(Type)0x2,curr,"array.get index must be an i32");
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id != 1) {
    left.id = (curr->ref->type).id;
    wasm::Type::Type(&local_50,(HeapType)0x6,Nullable);
    bVar1 = shouldBeSubType(this,left,local_50,(Expression *)curr,
                            "array.get target should be an array reference");
    if (bVar1) {
      local_38 = (uintptr_t)wasm::Type::getHeapType(&curr->ref->type);
      if (local_38 != 0xb) {
        bVar1 = shouldBeTrue<wasm::ArrayGet*>
                          (this,local_38 != 6,curr,
                           "array.get target should be a specific array reference");
        if (bVar1) {
          HeapType::getArray(&local_48);
          if ((local_48.id != 2) || (right.id = 2, local_40 == 0)) {
            shouldBeFalse<wasm::ArrayGet*>
                      (this,curr->signed_,curr,"non-packed get cannot be signed");
            right.id = local_48.id;
          }
          shouldBeEqual<wasm::ArrayGet*,wasm::Type>
                    (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)66>).
                                super_Expression.type.id,(Type)right.id,curr,
                     "array.get must have the proper type");
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayGet(ArrayGet* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "array.get requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->index->type, Type(Type::i32), curr, "array.get index must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->ref->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.get target should be an array reference")) {
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  if (heapType == HeapType::none) {
    return;
  }
  if (!shouldBeTrue(heapType != HeapType::array,
                    curr,
                    "array.get target should be a specific array reference")) {
    return;
  }
  const auto& element = heapType.getArray().element;
  // If the type is not packed, it must be marked internally as unsigned, by
  // convention.
  if (element.type != Type::i32 || element.packedType == Field::not_packed) {
    shouldBeFalse(curr->signed_, curr, "non-packed get cannot be signed");
  }
  shouldBeEqual(
    curr->type, element.type, curr, "array.get must have the proper type");
}